

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void parseVersionFromName(StringRef Name,uint *Major,uint *Minor,uint *Micro)

{
  size_t sVar1;
  byte *pbVar2;
  long lVar3;
  size_t sVar4;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  uint *Components [3];
  
  sVar4 = Name.Length;
  pbVar5 = (byte *)Name.Data;
  *Micro = 0;
  *Minor = 0;
  *Major = 0;
  Components[0] = Major;
  Components[1] = Minor;
  Components[2] = Micro;
  if (sVar4 != 0) {
    lVar3 = 0;
    while (bVar6 = *pbVar5, 0xf5 < (byte)(bVar6 - 0x3a)) {
      uVar7 = 0;
      sVar1 = sVar4 - 1;
      pbVar2 = pbVar5 + 1;
      do {
        pbVar5 = pbVar2;
        sVar4 = sVar1;
        uVar7 = ((uint)bVar6 + uVar7 * 10) - 0x30;
        if (sVar4 == 0) {
          *Components[lVar3] = uVar7;
          return;
        }
        bVar6 = *pbVar5;
        sVar1 = sVar4 - 1;
        pbVar2 = pbVar5 + 1;
      } while ((byte)(bVar6 - 0x30) < 10);
      *Components[lVar3] = uVar7;
      if (*pbVar5 == 0x2e) {
        sVar4 = sVar4 - 1;
        pbVar5 = pbVar5 + 1;
      }
      lVar3 = lVar3 + 1;
      if (lVar3 == 3) {
        return;
      }
      if (sVar4 == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void parseVersionFromName(StringRef Name, unsigned &Major,
                                 unsigned &Minor, unsigned &Micro) {
  // Any unset version defaults to 0.
  Major = Minor = Micro = 0;

  // Parse up to three components.
  unsigned *Components[3] = {&Major, &Minor, &Micro};
  for (unsigned i = 0; i != 3; ++i) {
    if (Name.empty() || Name[0] < '0' || Name[0] > '9')
      break;

    // Consume the leading number.
    *Components[i] = EatNumber(Name);

    // Consume the separator, if present.
    if (Name.startswith("."))
      Name = Name.substr(1);
  }
}